

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O2

void PixelToaster::convert_XBGRFFFF_to_XRGB1555(Pixel *source,integer16 *destination,uint count)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  float fVar5;
  
  for (lVar3 = 0; (ulong)count * 2 != lVar3; lVar3 = lVar3 + 2) {
    fVar5 = (float)(~((int)(&source->r)[lVar3 * 2] >> 0x1f) & (uint)(&source->r)[lVar3 * 2]);
    uVar1 = (ushort)((uint)(fVar5 + 1.0) >> 8) & 0x7c00;
    if (0x3f7ffffe < (int)fVar5) {
      uVar1 = 0x7c00;
    }
    fVar5 = (float)(~((int)(&source->g)[lVar3 * 2] >> 0x1f) & (uint)(&source->g)[lVar3 * 2]);
    uVar2 = (ushort)((uint)(fVar5 + 1.0) >> 0xd) & 0x3e0;
    if (0x3f7ffffe < (int)fVar5) {
      uVar2 = 0x3e0;
    }
    fVar5 = (float)(~((int)(&source->b)[lVar3 * 2] >> 0x1f) & (uint)(&source->b)[lVar3 * 2]);
    uVar4 = (ushort)((uint)(fVar5 + 1.0) >> 0x12) & 0x1f;
    if (0x3f7ffffe < (int)fVar5) {
      uVar4 = 0x1f;
    }
    *(ushort *)((long)destination + lVar3) = uVar2 | uVar1 | uVar4;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XRGB1555(const Pixel source[], integer16 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_5(source[i].r) >> 8;
        const integer32 g = clamped_fraction_5(source[i].g) >> 13;
        const integer32 b = clamped_fraction_5(source[i].b) >> 18;

        destination[i] = (integer16)(r | g | b);
    }
}